

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O1

void slang::ast::checkNodeUnused(Scope *scope,InstanceOverride *node)

{
  char_pointer puVar1;
  uint uVar2;
  char_pointer puVar3;
  uint uVar4;
  char_pointer puVar5;
  undefined1 auVar6 [16];
  iterator iVar7;
  
  if (node->rule != (ConfigRule *)0x0) {
    checkRuleUnused(scope,node->rule,false);
  }
  iVar7 = boost::unordered::detail::foa::
          table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
          ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                   *)node);
  iVar7.p_ = iVar7.p_;
joined_r0x0044d8e4:
  if (iVar7.p_ == (table_element_pointer)0x0) {
    return;
  }
  checkNodeUnused(scope,&(iVar7.p_)->second);
  puVar3 = iVar7.pc_ + 2;
  do {
    puVar5 = puVar3;
    puVar3 = iVar7.pc_;
    iVar7.p_ = iVar7.p_ + 1;
    if (((uint)iVar7.pc_ & 0xf) == 0xe) goto LAB_0044d93a;
    puVar1 = puVar5 + -1;
    iVar7.p_ = iVar7.p_;
    iVar7.pc_ = puVar3 + 1;
    puVar3 = puVar5 + 1;
  } while (*puVar1 == '\0');
  puVar5 = puVar5 + -1;
  if (*puVar1 == '\x01') {
    iVar7.p_ = (table_element_pointer)0x0;
  }
  goto LAB_0044d92e;
LAB_0044d93a:
  do {
    auVar6[0] = -(*puVar5 == '\0');
    auVar6[1] = -(puVar5[1] == '\0');
    auVar6[2] = -(puVar5[2] == '\0');
    auVar6[3] = -(puVar5[3] == '\0');
    auVar6[4] = -(puVar5[4] == '\0');
    auVar6[5] = -(puVar5[5] == '\0');
    auVar6[6] = -(puVar5[6] == '\0');
    auVar6[7] = -(puVar5[7] == '\0');
    auVar6[8] = -(puVar5[8] == '\0');
    auVar6[9] = -(puVar5[9] == '\0');
    auVar6[10] = -(puVar5[10] == '\0');
    auVar6[0xb] = -(puVar5[0xb] == '\0');
    auVar6[0xc] = -(puVar5[0xc] == '\0');
    auVar6[0xd] = -(puVar5[0xd] == '\0');
    auVar6[0xe] = -(puVar5[0xe] == '\0');
    auVar6[0xf] = -(puVar5[0xf] == '\0');
    uVar4 = (uint)(ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe);
    if (uVar4 == 0x7fff) {
      puVar5 = puVar5 + 0x10;
      iVar7.p_ = iVar7.p_ + 0xf;
    }
    else {
      uVar2 = 0;
      if ((uVar4 ^ 0x7fff) != 0) {
        for (; ((uVar4 ^ 0x7fff) >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      if (puVar5[uVar2] == '\x01') {
        iVar7.p_ = (table_element_pointer)0x0;
      }
      else {
        puVar5 = puVar5 + uVar2;
        iVar7.p_ = iVar7.p_ + uVar2;
      }
    }
  } while (uVar4 == 0x7fff);
LAB_0044d92e:
  iVar7.p_ = iVar7.p_;
  iVar7.pc_ = puVar5;
  goto joined_r0x0044d8e4;
}

Assistant:

static void checkNodeUnused(const Scope& scope, const ConfigBlockSymbol::InstanceOverride& node) {
    if (node.rule)
        checkRuleUnused(scope, *node.rule, false);

    for (auto& [name, child] : node.childNodes)
        checkNodeUnused(scope, child);
}